

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-mod-info.cc
# Opt level: O2

void pdfDumpInfoDict(char *fname)

{
  allocator<char> local_39;
  QPDF pdf;
  string local_30;
  
  QPDF::QPDF(&pdf);
  QPDF::processFile((char *)&pdf,fname);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,":\t",&local_39);
  dumpInfoDict(&pdf,(ostream *)&std::cout,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  QPDF::~QPDF(&pdf);
  return;
}

Assistant:

void
pdfDumpInfoDict(char const* fname)
{
    try {
        QPDF pdf;
        pdf.processFile(fname);
        dumpInfoDict(pdf);
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }
}